

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateCommonBuilderMethods
          (MessageGenerator *this,Printer *printer)

{
  MessageGenerator *pMVar1;
  int iVar2;
  FieldGenerator *pFVar3;
  Descriptor *pDVar4;
  Descriptor *in_RDX;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  Descriptor *descriptor_01;
  FileDescriptor *descriptor_02;
  Descriptor *descriptor_03;
  Descriptor *extraout_RDX;
  FileDescriptor *descriptor_04;
  Descriptor *descriptor_05;
  ulong uVar5;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  Descriptor *extraout_RDX_04;
  Descriptor *extraout_RDX_05;
  Descriptor *descriptor_06;
  Descriptor *extraout_RDX_06;
  long lVar6;
  int iVar7;
  uint uVar8;
  java *pjVar9;
  int iVar10;
  uint uVar11;
  int i;
  long lVar12;
  int i_2;
  char *text;
  string local_80;
  FieldGeneratorMap *local_60;
  MessageGenerator *local_58;
  string local_50;
  
  ClassName_abi_cxx11_(&local_80,(java *)this->descriptor_,in_RDX);
  io::Printer::Print(printer,
                     "// Construct using $classname$.newBuilder()\nprivate Builder() {\n  maybeForceBuilderInitialization();\n}\n\n"
                     ,"classname",&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  text = "private void maybeForceBuilderInitialization() {\n}\n";
  if (*(int *)(*(long *)(*(long *)((java *)this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
    ClassName_abi_cxx11_(&local_80,(java *)this->descriptor_,descriptor);
    io::Printer::Print(printer,
                       "private Builder(\n    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n  super(parent);\n  maybeForceBuilderInitialization();\n}\n"
                       ,"classname",&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
      io::Printer::Print(printer,
                         "private void maybeForceBuilderInitialization() {\n  if (com.google.protobuf.GeneratedMessage.alwaysUseFieldBuilders) {\n"
                        );
      io::Printer::Indent(printer);
      io::Printer::Indent(printer);
      lVar6 = 0;
      for (lVar12 = 0; lVar12 < *(int *)(this->descriptor_ + 0x2c); lVar12 = lVar12 + 1) {
        pFVar3 = FieldGeneratorMap::get
                           (&this->field_generators_,
                            (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar6));
        (*pFVar3->_vptr_FieldGenerator[0x10])(pFVar3,printer);
        lVar6 = lVar6 + 0x78;
      }
      io::Printer::Outdent(printer);
      io::Printer::Outdent(printer);
      text = "  }\n}\n";
    }
  }
  io::Printer::Print(printer,text);
  ClassName_abi_cxx11_(&local_80,(java *)this->descriptor_,descriptor_00);
  io::Printer::Print(printer,
                     "private static Builder create() {\n  return new Builder();\n}\n\npublic Builder clear() {\n  super.clear();\n"
                     ,"classname",&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  io::Printer::Indent(printer);
  local_60 = &this->field_generators_;
  lVar6 = 0;
  for (lVar12 = 0; lVar12 < *(int *)(this->descriptor_ + 0x2c); lVar12 = lVar12 + 1) {
    pFVar3 = FieldGeneratorMap::get
                       (local_60,(FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar6));
    (*pFVar3->_vptr_FieldGenerator[8])(pFVar3,printer);
    lVar6 = lVar6 + 0x78;
  }
  io::Printer::Outdent(printer);
  ClassName_abi_cxx11_(&local_80,(java *)this->descriptor_,descriptor_01);
  io::Printer::Print(printer,
                     "  return this;\n}\n\npublic Builder clone() {\n  return create().mergeFrom(buildPartial());\n}\n\n"
                     ,"classname",&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  pjVar9 = (java *)this->descriptor_;
  descriptor_04 = descriptor_02;
  if (*(int *)(*(long *)(*(java **)(pjVar9 + 0x10) + 0x88) + 0x50) != 3) {
    ClassName_abi_cxx11_(&local_80,*(java **)(pjVar9 + 0x10),descriptor_02);
    (anonymous_namespace)::UniqueFileScopeIdentifier_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)this->descriptor_,descriptor_03);
    io::Printer::Print(printer,
                       "public com.google.protobuf.Descriptors.Descriptor\n    getDescriptorForType() {\n  return $fileclass$.internal_$identifier$_descriptor;\n}\n\n"
                       ,"fileclass",&local_80,"identifier",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_80);
    pjVar9 = (java *)this->descriptor_;
    descriptor_04 = (FileDescriptor *)extraout_RDX;
  }
  ClassName_abi_cxx11_(&local_80,pjVar9,(Descriptor *)descriptor_04);
  io::Printer::Print(printer,
                     "public $classname$ getDefaultInstanceForType() {\n  return $classname$.getDefaultInstance();\n}\n\n"
                     ,"classname",&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  local_58 = this;
  ClassName_abi_cxx11_(&local_80,(java *)this->descriptor_,descriptor_05);
  io::Printer::Print(printer,
                     "public $classname$ build() {\n  $classname$ result = buildPartial();\n  if (!result.isInitialized()) {\n    throw newUninitializedMessageException(result);\n  }\n  return result;\n}\n\npublic $classname$ buildPartial() {\n  $classname$ result = new $classname$(this);\n"
                     ,"classname",&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  io::Printer::Indent(printer);
  lVar6 = 0;
  iVar10 = 0;
  iVar7 = 0;
  for (lVar12 = 0; lVar12 < *(int *)(local_58->descriptor_ + 0x2c); lVar12 = lVar12 + 1) {
    pFVar3 = FieldGeneratorMap::get
                       (local_60,(FieldDescriptor *)
                                 (*(long *)(local_58->descriptor_ + 0x30) + lVar6));
    iVar2 = (*pFVar3->_vptr_FieldGenerator[3])(pFVar3);
    iVar10 = iVar10 + iVar2;
    iVar2 = (*pFVar3->_vptr_FieldGenerator[2])(pFVar3);
    iVar7 = iVar7 + iVar2;
    lVar6 = lVar6 + 0x78;
  }
  iVar10 = (iVar10 + 0x1f) / 0x20;
  uVar8 = (iVar7 + 0x1f) / 0x20;
  uVar5 = (long)(iVar7 + 0x1f) % 0x20 & 0xffffffff;
  pjVar9 = (java *)0x0;
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  for (; iVar10 != (int)pjVar9; pjVar9 = (java *)(ulong)((int)pjVar9 + 1)) {
    GetBitFieldName_abi_cxx11_(&local_80,pjVar9,(int)uVar5);
    io::Printer::Print(printer,"int from_$bit_field_name$ = $bit_field_name$;\n","bit_field_name",
                       &local_80);
    std::__cxx11::string::~string((string *)&local_80);
    uVar5 = extraout_RDX_00;
  }
  uVar11 = 0;
  if ((int)uVar8 < 1) {
    uVar8 = uVar11;
  }
  for (; pMVar1 = local_58, uVar8 != uVar11; uVar11 = uVar11 + 1) {
    GetBitFieldName_abi_cxx11_(&local_80,(java *)(ulong)uVar11,(int)uVar5);
    io::Printer::Print(printer,"int to_$bit_field_name$ = 0;\n","bit_field_name",&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    uVar5 = extraout_RDX_01;
  }
  lVar6 = 0;
  for (lVar12 = 0; lVar12 < *(int *)(pMVar1->descriptor_ + 0x2c); lVar12 = lVar12 + 1) {
    pFVar3 = FieldGeneratorMap::get
                       (local_60,(FieldDescriptor *)(*(long *)(pMVar1->descriptor_ + 0x30) + lVar6))
    ;
    (*pFVar3->_vptr_FieldGenerator[10])(pFVar3,printer);
    lVar6 = lVar6 + 0x78;
    uVar5 = extraout_RDX_02;
  }
  for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
    GetBitFieldName_abi_cxx11_(&local_80,(java *)(ulong)uVar11,(int)uVar5);
    io::Printer::Print(printer,"result.$bit_field_name$ = to_$bit_field_name$;\n","bit_field_name",
                       &local_80);
    std::__cxx11::string::~string((string *)&local_80);
    uVar5 = extraout_RDX_03;
  }
  io::Printer::Outdent(printer);
  pMVar1 = local_58;
  pjVar9 = (java *)local_58->descriptor_;
  pDVar4 = extraout_RDX_04;
  if (*(int *)(*(long *)(*(long *)(pjVar9 + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,"  onBuilt();\n");
    pjVar9 = (java *)pMVar1->descriptor_;
    pDVar4 = extraout_RDX_05;
  }
  ClassName_abi_cxx11_(&local_80,pjVar9,pDVar4);
  io::Printer::Print(printer,"  return result;\n}\n\n","classname",&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  pjVar9 = (java *)pMVar1->descriptor_;
  iVar7 = *(int *)(*(long *)(*(long *)(pjVar9 + 0x10) + 0x88) + 0x50);
  if (iVar7 != 2) {
    pDVar4 = descriptor_06;
    if (iVar7 != 3) {
      ClassName_abi_cxx11_(&local_80,pjVar9,descriptor_06);
      io::Printer::Print(printer,
                         "public Builder mergeFrom(com.google.protobuf.Message other) {\n  if (other instanceof $classname$) {\n    return mergeFrom(($classname$)other);\n  } else {\n    super.mergeFrom(other);\n    return this;\n  }\n}\n\n"
                         ,"classname",&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      pjVar9 = (java *)pMVar1->descriptor_;
      pDVar4 = extraout_RDX_06;
    }
    ClassName_abi_cxx11_(&local_80,pjVar9,pDVar4);
    io::Printer::Print(printer,
                       "public Builder mergeFrom($classname$ other) {\n  if (other == $classname$.getDefaultInstance()) return this;\n"
                       ,"classname",&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    io::Printer::Indent(printer);
    lVar6 = 0;
    for (lVar12 = 0; lVar12 < *(int *)(pMVar1->descriptor_ + 0x2c); lVar12 = lVar12 + 1) {
      pFVar3 = FieldGeneratorMap::get
                         (local_60,(FieldDescriptor *)
                                   (*(long *)(pMVar1->descriptor_ + 0x30) + lVar6));
      (*pFVar3->_vptr_FieldGenerator[9])(pFVar3,printer);
      lVar6 = lVar6 + 0x78;
    }
    io::Printer::Outdent(printer);
    pDVar4 = pMVar1->descriptor_;
    if (0 < *(int *)(pDVar4 + 0x58)) {
      io::Printer::Print(printer,"  this.mergeExtensionFields(other);\n");
      pDVar4 = pMVar1->descriptor_;
    }
    if (*(int *)(*(long *)(*(long *)(pDVar4 + 0x10) + 0x88) + 0x50) != 3) {
      io::Printer::Print(printer,"  this.mergeUnknownFields(other.getUnknownFields());\n");
    }
    io::Printer::Print(printer,"  return this;\n}\n\n");
  }
  return;
}

Assistant:

void MessageGenerator::GenerateCommonBuilderMethods(io::Printer* printer) {
  printer->Print(
    "// Construct using $classname$.newBuilder()\n"
    "private Builder() {\n"
    "  maybeForceBuilderInitialization();\n"
    "}\n"
    "\n",
    "classname", ClassName(descriptor_));

  if (HasDescriptorMethods(descriptor_)) {
    printer->Print(
      "private Builder(\n"
      "    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n"
      "  super(parent);\n"
      "  maybeForceBuilderInitialization();\n"
      "}\n",
      "classname", ClassName(descriptor_));
  }


  if (HasNestedBuilders(descriptor_)) {
    printer->Print(
      "private void maybeForceBuilderInitialization() {\n"
      "  if (com.google.protobuf.GeneratedMessage.alwaysUseFieldBuilders) {\n");

    printer->Indent();
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(descriptor_->field(i))
          .GenerateFieldBuilderInitializationCode(printer);
    }
    printer->Outdent();
    printer->Outdent();

    printer->Print(
      "  }\n"
      "}\n");
  } else {
    printer->Print(
      "private void maybeForceBuilderInitialization() {\n"
      "}\n");
  }

  printer->Print(
    "private static Builder create() {\n"
    "  return new Builder();\n"
    "}\n"
    "\n"
    "public Builder clear() {\n"
    "  super.clear();\n",
    "classname", ClassName(descriptor_));

  printer->Indent();

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
        .GenerateBuilderClearCode(printer);
  }

  printer->Outdent();

  printer->Print(
    "  return this;\n"
    "}\n"
    "\n"
    "public Builder clone() {\n"
    "  return create().mergeFrom(buildPartial());\n"
    "}\n"
    "\n",
    "classname", ClassName(descriptor_));
  if (HasDescriptorMethods(descriptor_)) {
    printer->Print(
      "public com.google.protobuf.Descriptors.Descriptor\n"
      "    getDescriptorForType() {\n"
      "  return $fileclass$.internal_$identifier$_descriptor;\n"
      "}\n"
      "\n",
      "fileclass", ClassName(descriptor_->file()),
      "identifier", UniqueFileScopeIdentifier(descriptor_));
  }
  printer->Print(
    "public $classname$ getDefaultInstanceForType() {\n"
    "  return $classname$.getDefaultInstance();\n"
    "}\n"
    "\n",
    "classname", ClassName(descriptor_));

  // -----------------------------------------------------------------

  printer->Print(
    "public $classname$ build() {\n"
    "  $classname$ result = buildPartial();\n"
    "  if (!result.isInitialized()) {\n"
    "    throw newUninitializedMessageException(result);\n"
    "  }\n"
    "  return result;\n"
    "}\n"
    "\n"
    "public $classname$ buildPartial() {\n"
    "  $classname$ result = new $classname$(this);\n",
    "classname", ClassName(descriptor_));

  printer->Indent();

  // Local vars for from and to bit fields to avoid accessing the builder and
  // message over and over for these fields. Seems to provide a slight
  // perforamance improvement in micro benchmark and this is also what proto1
  // code does.
  int totalBuilderBits = 0;
  int totalMessageBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldGenerator& field = field_generators_.get(descriptor_->field(i));
    totalBuilderBits += field.GetNumBitsForBuilder();
    totalMessageBits += field.GetNumBitsForMessage();
  }
  int totalBuilderInts = (totalBuilderBits + 31) / 32;
  int totalMessageInts = (totalMessageBits + 31) / 32;
  for (int i = 0; i < totalBuilderInts; i++) {
    printer->Print("int from_$bit_field_name$ = $bit_field_name$;\n",
      "bit_field_name", GetBitFieldName(i));
  }
  for (int i = 0; i < totalMessageInts; i++) {
    printer->Print("int to_$bit_field_name$ = 0;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  // Output generation code for each field.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i)).GenerateBuildingCode(printer);
  }

  // Copy the bit field results to the generated message
  for (int i = 0; i < totalMessageInts; i++) {
    printer->Print("result.$bit_field_name$ = to_$bit_field_name$;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  printer->Outdent();

  if (HasDescriptorMethods(descriptor_)) {
    printer->Print(
    "  onBuilt();\n");
  }

  printer->Print(
    "  return result;\n"
    "}\n"
    "\n",
    "classname", ClassName(descriptor_));

  // -----------------------------------------------------------------

  if (HasGeneratedMethods(descriptor_)) {
    // MergeFrom(Message other) requires the ability to distinguish the other
    // messages type by its descriptor.
    if (HasDescriptorMethods(descriptor_)) {
      printer->Print(
        "public Builder mergeFrom(com.google.protobuf.Message other) {\n"
        "  if (other instanceof $classname$) {\n"
        "    return mergeFrom(($classname$)other);\n"
        "  } else {\n"
        "    super.mergeFrom(other);\n"
        "    return this;\n"
        "  }\n"
        "}\n"
        "\n",
        "classname", ClassName(descriptor_));
    }

    printer->Print(
      "public Builder mergeFrom($classname$ other) {\n"
      // Optimization:  If other is the default instance, we know none of its
      //   fields are set so we can skip the merge.
      "  if (other == $classname$.getDefaultInstance()) return this;\n",
      "classname", ClassName(descriptor_));
    printer->Indent();

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(descriptor_->field(i)).GenerateMergingCode(printer);
    }

    printer->Outdent();

    // if message type has extensions
    if (descriptor_->extension_range_count() > 0) {
      printer->Print(
        "  this.mergeExtensionFields(other);\n");
    }

    if (HasUnknownFields(descriptor_)) {
      printer->Print(
        "  this.mergeUnknownFields(other.getUnknownFields());\n");
    }

    printer->Print(
      "  return this;\n"
      "}\n"
      "\n");
  }
}